

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O3

int SUNMatScaleAdd_Band(realtype c,SUNMatrix A,SUNMatrix B)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  int iVar9;
  SUNMatrix A_00;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  iVar9 = SMCompatible_Band(A,B);
  if (iVar9 == 0) {
    iVar9 = 1;
  }
  else {
    pvVar1 = B->content;
    lVar12 = *(long *)((long)pvVar1 + 0x18);
    pvVar2 = A->content;
    lVar3 = *(long *)((long)pvVar2 + 0x18);
    if (lVar3 < lVar12) {
      lVar10 = *(long *)((long)pvVar2 + 0x20);
      lVar11 = *(long *)((long)pvVar1 + 0x20);
    }
    else {
      lVar11 = *(long *)((long)pvVar1 + 0x20);
      lVar10 = *(long *)((long)pvVar2 + 0x20);
      if (lVar11 <= lVar10) {
        lVar3 = *(long *)((long)pvVar2 + 8);
        if (0 < lVar3) {
          lVar10 = *(long *)((long)pvVar2 + 0x28);
          lVar4 = *(long *)((long)pvVar2 + 0x40);
          lVar5 = *(long *)((long)pvVar1 + 0x28);
          lVar6 = *(long *)((long)pvVar1 + 0x40);
          lVar14 = 0;
          do {
            if (SBORROW8(lVar11,-lVar12) == lVar11 + lVar12 < 0) {
              lVar13 = *(long *)(lVar4 + lVar14 * 8) + lVar10 * 8;
              lVar7 = *(long *)(lVar6 + lVar14 * 8);
              lVar15 = -lVar12;
              do {
                *(double *)(lVar13 + lVar15 * 8) =
                     *(double *)(lVar13 + lVar15 * 8) * c +
                     *(double *)(lVar7 + lVar5 * 8 + lVar15 * 8);
                lVar15 = lVar15 + 1;
              } while (lVar11 + 1 != lVar15);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != lVar3);
        }
        return 0;
      }
    }
    if (lVar11 < lVar10) {
      lVar11 = lVar10;
    }
    if (lVar12 < lVar3) {
      lVar12 = lVar3;
    }
    lVar3 = *(long *)((long)pvVar2 + 8);
    lVar10 = lVar3 + -1;
    if (lVar11 + lVar12 < lVar3) {
      lVar10 = lVar11 + lVar12;
    }
    A_00 = SUNBandMatrixStorage(lVar3,lVar12,lVar11,lVar10);
    pvVar1 = A->content;
    lVar12 = *(long *)((long)pvVar1 + 8);
    pvVar2 = A_00->content;
    if (0 < lVar12) {
      lVar3 = *(long *)((long)pvVar1 + 0x40);
      lVar10 = *(long *)((long)pvVar1 + 0x20);
      lVar11 = *(long *)((long)pvVar1 + 0x28);
      lVar4 = *(long *)((long)pvVar2 + 0x28);
      lVar5 = *(long *)((long)pvVar2 + 0x40);
      lVar6 = *(long *)((long)pvVar1 + 0x18);
      lVar14 = 0;
      do {
        if (-lVar6 <= lVar10) {
          lVar7 = *(long *)(lVar3 + lVar14 * 8);
          lVar15 = *(long *)(lVar5 + lVar14 * 8);
          lVar13 = -lVar6;
          do {
            *(double *)(lVar15 + lVar4 * 8 + lVar13 * 8) =
                 *(double *)(lVar7 + lVar11 * 8 + lVar13 * 8) * c;
            lVar13 = lVar13 + 1;
          } while (lVar10 + 1 != lVar13);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != lVar12);
    }
    pvVar8 = B->content;
    lVar12 = *(long *)((long)pvVar8 + 8);
    if (0 < lVar12) {
      lVar3 = *(long *)((long)pvVar8 + 0x40);
      lVar10 = *(long *)((long)pvVar8 + 0x20);
      lVar11 = *(long *)((long)pvVar8 + 0x28);
      lVar4 = *(long *)((long)pvVar2 + 0x28);
      lVar5 = *(long *)((long)pvVar2 + 0x40);
      lVar6 = *(long *)((long)pvVar8 + 0x18);
      lVar14 = 0;
      do {
        if (-lVar6 <= lVar10) {
          lVar7 = *(long *)(lVar3 + lVar14 * 8);
          lVar13 = *(long *)(lVar5 + lVar14 * 8) + lVar4 * 8;
          lVar15 = -lVar6;
          do {
            *(double *)(lVar13 + lVar15 * 8) =
                 *(double *)(lVar7 + lVar11 * 8 + lVar15 * 8) + *(double *)(lVar13 + lVar15 * 8);
            lVar15 = lVar15 + 1;
          } while (lVar10 + 1 != lVar15);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != lVar12);
    }
    free(*(void **)((long)pvVar1 + 0x30));
    pvVar1 = A->content;
    iVar9 = 0;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    free(*(void **)((long)pvVar1 + 0x40));
    free(A->content);
    A->content = pvVar2;
    A_00->content = (void *)0x0;
    SUNMatDestroy_Band(A_00);
  }
  return iVar9;
}

Assistant:

int SUNMatScaleAdd_Band(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j;
  realtype *A_colj, *B_colj;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Band(A, B))
    return 1;

  /* Call separate routine in B has larger bandwidth(s) than A */
  if ( (SM_UBAND_B(B) > SM_UBAND_B(A)) ||
       (SM_LBAND_B(B) > SM_LBAND_B(A)) ) {
    return SMScaleAddNew_Band(c,A,B);
  }
  
  /* Otherwise, perform operation in-place */
  for (j=0; j<SM_COLUMNS_B(A); j++) {
    A_colj = SM_COLUMN_B(A,j);
    B_colj = SM_COLUMN_B(B,j);
    for (i=-SM_UBAND_B(B); i<=SM_LBAND_B(B); i++)
      A_colj[i] = c*A_colj[i] + B_colj[i];
  }
  return 0;
}